

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O1

void __thiscall
helix::event::event(event *this,event_mask mask,string *symbol,uint64_t timestamp,order_book *ob,
                   trade *t)

{
  pointer pcVar1;
  
  this->_mask = mask;
  (this->_symbol)._M_dataplus._M_p = (pointer)&(this->_symbol).field_2;
  pcVar1 = (symbol->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_symbol,pcVar1,pcVar1 + symbol->_M_string_length);
  this->_timestamp = timestamp;
  this->_ob = ob;
  this->_trade = t;
  return;
}

Assistant:

event::event(event_mask mask, const std::string& symbol, uint64_t timestamp, order_book* ob, trade* t)
    : _mask{mask}
    , _symbol{symbol}
    , _timestamp{timestamp}
    , _ob{ob}
    , _trade{t}
{
}